

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_combined(IsoForest *model,ExtIsoForest *model_ext,Imputer *imputer,
                       TreesIndexer *indexer,char *optional_metadata,size_t size_optional_metadata,
                       ostream *out)

{
  size_t in_stack_00000068;
  char *in_stack_00000070;
  TreesIndexer *in_stack_00000078;
  Imputer *in_stack_00000080;
  ExtIsoForest *in_stack_00000088;
  IsoForest *in_stack_00000090;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_000000a0;
  
  serialize_combined<std::ostream>
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
             in_stack_00000070,in_stack_00000068,in_stack_000000a0);
  return;
}

Assistant:

void serialize_combined
(
    const IsoForest *model,
    const ExtIsoForest *model_ext,
    const Imputer *imputer,
    const TreesIndexer *indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    std::ostream &out
)
{
    serialize_combined<std::ostream>(
        model,
        model_ext,
        imputer,
        indexer,
        optional_metadata,
        size_optional_metadata,
        out
    );
}